

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

int kinLsPSetup(void *kinmem)

{
  int iVar1;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  KINLsMem local_18;
  KINMem local_10;
  
  iVar1 = kinLs_AccessLMem(kinmem,"kinLsPSetup",&local_10,&local_18);
  if (iVar1 == 0) {
    iVar1 = (*local_18->pset)(local_10->kin_uu,local_10->kin_uscale,local_10->kin_fval,
                              local_10->kin_fscale,local_18->pdata);
    local_18->npe = local_18->npe + 1;
  }
  return iVar1;
}

Assistant:

int kinLsPSetup(void *kinmem)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, "kinLsPSetup",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);

  /* Call user pset routine to update preconditioner */
  retval = kinls_mem->pset(kin_mem->kin_uu, kin_mem->kin_uscale,
                           kin_mem->kin_fval, kin_mem->kin_fscale,
                           kinls_mem->pdata);
  kinls_mem->npe++;
  return(retval);
}